

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O1

Vec_Ptr_t * Vec_PtrStart(int nSize)

{
  Vec_Ptr_t *pVVar1;
  void **__s;
  int iVar2;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  iVar2 = 8;
  if (6 < nSize - 1U) {
    iVar2 = nSize;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar2;
  if (iVar2 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar2 << 3);
  }
  pVVar1->pArray = __s;
  pVVar1->nSize = nSize;
  memset(__s,0,(long)nSize << 3);
  return pVVar1;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrStart( int nSize )
{
    Vec_Ptr_t * p;
    p = Vec_PtrAlloc( nSize );
    p->nSize = nSize;
    memset( p->pArray, 0, sizeof(void *) * (size_t)nSize );
    return p;
}